

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_annotator.h
# Opt level: O0

void __thiscall
ctemplate::TextTemplateAnnotator::~TextTemplateAnnotator(TextTemplateAnnotator *this)

{
  TextTemplateAnnotator *this_local;
  
  TemplateAnnotator::~TemplateAnnotator((TemplateAnnotator *)this);
  return;
}

Assistant:

class CTEMPLATE_EXPORT TextTemplateAnnotator : public TemplateAnnotator {
 public:
  TextTemplateAnnotator() { }
  virtual void EmitOpenInclude(ExpandEmitter* emitter, const std::string& value);
  virtual void EmitCloseInclude(ExpandEmitter* emitter);
  virtual void EmitOpenFile(ExpandEmitter* emitter, const std::string& value);
  virtual void EmitCloseFile(ExpandEmitter* emitter);
  virtual void EmitOpenSection(ExpandEmitter* emitter, const std::string& value);
  virtual void EmitCloseSection(ExpandEmitter* emitter);
  virtual void EmitOpenVariable(ExpandEmitter* emitter, const std::string& value);
  virtual void EmitCloseVariable(ExpandEmitter* emitter);
  virtual void EmitFileIsMissing(ExpandEmitter* emitter,
                                 const std::string& value);

 private:
  // Can't invoke copy constructor or assignment operator
  TextTemplateAnnotator(const TextTemplateAnnotator&);
  void operator=(const TextTemplateAnnotator&);
}